

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  uint uVar1;
  int iVar2;
  SRes SVar3;
  CBuf *pCVar4;
  UInt64 size;
  int __result___2;
  int __result___1;
  CBuf *tempBuf_1;
  UInt64 unpackSize;
  CBuf *tempBuf;
  int __result__;
  UInt32 numFolders;
  CSubStreamInfo ssi;
  UInt64 UStack_48;
  UInt32 fo;
  UInt64 dataStartPos;
  CSzAr *p_local;
  UInt64 baseOffset_local;
  CBuf *pCStack_28;
  UInt32 numFoldersMax_local;
  CBuf *tempBufs_local;
  CSzData *sd_local;
  ILookInStream *inStream_local;
  
  UStack_48 = 0;
  dataStartPos = (UInt64)p;
  p_local = (CSzAr *)baseOffset;
  baseOffset_local._4_4_ = numFoldersMax;
  pCStack_28 = tempBufs;
  tempBufs_local = (CBuf *)sd;
  sd_local = (CSzData *)inStream;
  inStream_local._4_4_ =
       SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&stack0xffffffffffffffb8,
                         (CSubStreamInfo *)&__result__,allocTemp);
  if (inStream_local._4_4_ == 0) {
    uVar1 = *(uint *)(dataStartPos + 4);
    if (uVar1 == 0) {
      inStream_local._4_4_ = 0x10;
    }
    else if (baseOffset_local._4_4_ < uVar1) {
      inStream_local._4_4_ = 4;
    }
    else {
      UStack_48 = (long)&p_local->NumPackStreams + UStack_48;
      for (ssi.sdCRCs.Size._4_4_ = 0; ssi.sdCRCs.Size._4_4_ < uVar1;
          ssi.sdCRCs.Size._4_4_ = ssi.sdCRCs.Size._4_4_ + 1) {
        Buf_Init(pCStack_28 + ssi.sdCRCs.Size._4_4_);
      }
      for (ssi.sdCRCs.Size._4_4_ = 0; ssi.sdCRCs.Size._4_4_ < uVar1;
          ssi.sdCRCs.Size._4_4_ = ssi.sdCRCs.Size._4_4_ + 1) {
        pCVar4 = pCStack_28 + ssi.sdCRCs.Size._4_4_;
        size = SzAr_GetFolderUnpackSize((CSzAr *)dataStartPos,ssi.sdCRCs.Size._4_4_);
        iVar2 = Buf_Create(pCVar4,size,allocTemp);
        if (iVar2 == 0) {
          return 2;
        }
      }
      for (ssi.sdCRCs.Size._4_4_ = 0; ssi.sdCRCs.Size._4_4_ < uVar1;
          ssi.sdCRCs.Size._4_4_ = ssi.sdCRCs.Size._4_4_ + 1) {
        pCVar4 = pCStack_28 + ssi.sdCRCs.Size._4_4_;
        SVar3 = LookInStream_SeekTo((ILookInStream *)sd_local,UStack_48);
        if (SVar3 != 0) {
          return SVar3;
        }
        SVar3 = SzAr_DecodeFolder((CSzAr *)dataStartPos,ssi.sdCRCs.Size._4_4_,
                                  (ILookInStream *)sd_local,UStack_48,pCVar4->data,pCVar4->size,
                                  allocTemp);
        if (SVar3 != 0) {
          return SVar3;
        }
      }
      inStream_local._4_4_ = 0;
    }
  }
  return inStream_local._4_4_;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos = 0;
  UInt32 fo;
  CSubStreamInfo ssi;
  UInt32 numFolders;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));

  numFolders = p->NumFolders;
  if (numFolders == 0)
    return SZ_ERROR_ARCHIVE;
  else if (numFolders > numFoldersMax)
    return SZ_ERROR_UNSUPPORTED;

  dataStartPos += baseOffset;

  for (fo = 0; fo < numFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < numFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < numFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}